

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O1

UA_StatusCode
UA_Server_addDataSourceVariableNode
          (UA_Server *server,UA_NodeId requestedNewNodeId,UA_NodeId parentNodeId,
          UA_NodeId referenceTypeId,UA_QualifiedName browseName,UA_NodeId typeDefinition,
          UA_VariableAttributes attr,UA_DataSource dataSource,UA_NodeId *outNewNodeId)

{
  UA_VariableNode *node;
  UA_UInt32 *attr_00;
  UA_StatusCode UVar1;
  UA_StatusCode UVar2;
  void *pvVar3;
  undefined1 auStack_268 [8];
  UA_AddNodesItem item;
  UA_VariableAttributes editAttr;
  UA_DataValue value;
  
  pvVar3 = calloc(1,0x160);
  if (pvVar3 == (void *)0x0) {
    pvVar3 = (void *)0x0;
  }
  else {
    *(undefined4 *)((long)pvVar3 + 0x20) = 2;
  }
  node = (UA_VariableNode *)((long)pvVar3 + 8);
  if (pvVar3 == (void *)0x0) {
    UVar1 = 0x80030000;
  }
  else {
    memcpy(&item.typeDefinition.serverIndex,&attr,200);
    editAttr.historizing = false;
    editAttr._193_7_ = 0;
    if (dataSource.read ==
        (_func_UA_StatusCode_void_ptr_UA_NodeId_UA_Boolean_UA_NumericRange_ptr_UA_DataValue_ptr *)
        0x0) {
      UVar1 = 0x80740000;
    }
    else {
      UVar1 = (*dataSource.read)(dataSource.handle,requestedNewNodeId,false,(UA_NumericRange *)0x0,
                                 (UA_DataValue *)&editAttr.historizing);
    }
    editAttr.value.data = (void *)0x0;
    editAttr.value.arrayDimensionsSize = 0;
    editAttr.value.storageType = UA_VARIANT_DATA;
    editAttr.value._12_4_ = 0;
    editAttr.value.arrayLength = 0;
    editAttr.writeMask = 0;
    editAttr.userWriteMask = 0;
    editAttr.value.type = (UA_DataType *)0x0;
    if (UVar1 == 0) {
      memset((UA_AddNodesItem *)auStack_268,0,0xf8);
      item.requestedNewNodeId.nodeId.identifier.string.length =
           (size_t)requestedNewNodeId.identifier.string.data;
      item.referenceTypeId.identifier.string.data = (UA_Byte *)requestedNewNodeId._0_8_;
      item.requestedNewNodeId.nodeId.namespaceIndex = requestedNewNodeId.identifier._0_2_;
      item.requestedNewNodeId.nodeId._2_2_ = requestedNewNodeId.identifier._2_2_;
      item.requestedNewNodeId.nodeId.identifierType = requestedNewNodeId.identifier._4_4_;
      item.browseName.name.length = (size_t)browseName.name.data;
      item.requestedNewNodeId._40_8_ = browseName._0_8_;
      item.browseName._0_8_ = browseName.name.length;
      item.nodeAttributes.content.encoded.body.data = (UA_Byte *)typeDefinition._0_8_;
      item.typeDefinition.nodeId.namespaceIndex = typeDefinition.identifier._0_2_;
      item.typeDefinition.nodeId._2_2_ = typeDefinition.identifier._2_2_;
      item.typeDefinition.nodeId.identifierType = typeDefinition.identifier._4_4_;
      item.typeDefinition.nodeId.identifier.string.length =
           (size_t)typeDefinition.identifier.string.data;
      auStack_268._0_2_ = parentNodeId.namespaceIndex;
      auStack_268._2_2_ = parentNodeId._2_2_;
      auStack_268._4_4_ = parentNodeId.identifierType;
      item.parentNodeId.nodeId.namespaceIndex = parentNodeId.identifier._0_2_;
      item.parentNodeId.nodeId._2_2_ = parentNodeId.identifier._2_2_;
      item.parentNodeId.nodeId.identifierType = parentNodeId.identifier._4_4_;
      item.parentNodeId.nodeId.identifier.string.length =
           (size_t)parentNodeId.identifier.string.data;
      attr_00 = &item.typeDefinition.serverIndex;
      UVar2 = copyStandardAttributes
                        ((UA_Node *)node,(UA_AddNodesItem *)auStack_268,(UA_NodeAttributes *)attr_00
                        );
      *(undefined1 *)((long)pvVar3 + 0x148) = editAttr.arrayDimensions._0_1_;
      *(undefined1 *)((long)pvVar3 + 0x149) = editAttr.arrayDimensions._1_1_;
      *(undefined1 *)((long)pvVar3 + 0x158) = editAttr.minimumSamplingInterval._0_1_;
      *(undefined8 *)((long)pvVar3 + 0x150) = editAttr._176_8_;
      UVar1 = copyCommonVariableAttributes
                        (server,node,(UA_AddNodesItem *)auStack_268,(UA_VariableAttributes *)attr_00
                        );
      deleteMembers_noInit((void *)((long)pvVar3 + 0xd0),UA_TYPES + 0x16);
      *(undefined8 *)((long)pvVar3 + 0x120) = 0;
      *(undefined8 *)((long)pvVar3 + 0x128) = 0;
      *(undefined8 *)((long)pvVar3 + 0x110) = 0;
      *(undefined8 *)((long)pvVar3 + 0x118) = 0;
      *(undefined8 *)((long)pvVar3 + 0x100) = 0;
      *(undefined8 *)((long)pvVar3 + 0x108) = 0;
      *(undefined8 *)((long)pvVar3 + 0xf0) = 0;
      *(undefined8 *)((long)pvVar3 + 0xf8) = 0;
      *(undefined8 *)((long)pvVar3 + 0xe0) = 0;
      *(undefined8 *)((long)pvVar3 + 0xe8) = 0;
      *(undefined8 *)((long)pvVar3 + 0xd0) = 0;
      *(undefined8 *)((long)pvVar3 + 0xd8) = 0;
      *(undefined4 *)((long)pvVar3 + 200) = 1;
      *(void **)((long)pvVar3 + 0xd0) = dataSource.handle;
      *(_func_UA_StatusCode_void_ptr_UA_NodeId_UA_Boolean_UA_NumericRange_ptr_UA_DataValue_ptr **)
       ((long)pvVar3 + 0xd8) = dataSource.read;
      *(_func_UA_StatusCode_void_ptr_UA_NodeId_UA_Variant_ptr_UA_NumericRange_ptr **)
       ((long)pvVar3 + 0xe0) = dataSource.write;
      deleteMembers_noInit(&editAttr.historizing,UA_TYPES + 0x16);
      UVar1 = UVar1 | UVar2;
      editAttr.historizing = false;
      editAttr._193_7_ = 0;
      if (UVar1 == 0) {
        UVar1 = Service_AddNodes_existing
                          (server,&adminSession,(UA_Node *)node,&parentNodeId,&referenceTypeId,
                           &typeDefinition,(UA_InstantiationCallback *)0x0,outNewNodeId);
        return UVar1;
      }
    }
    UA_NodeStore_deleteNode((UA_Node *)node);
  }
  return UVar1;
}

Assistant:

UA_StatusCode
UA_Server_addDataSourceVariableNode(UA_Server *server, const UA_NodeId requestedNewNodeId,
                                    const UA_NodeId parentNodeId, const UA_NodeId referenceTypeId,
                                    const UA_QualifiedName browseName, const UA_NodeId typeDefinition,
                                    const UA_VariableAttributes attr, const UA_DataSource dataSource,
                                    UA_NodeId *outNewNodeId) {
    /* Create the new node */
    UA_VariableNode *node = UA_NodeStore_newVariableNode();
    if(!node)
        return UA_STATUSCODE_BADOUTOFMEMORY;

    /* Read the current value (to do typechecking) */
    UA_StatusCode retval = UA_STATUSCODE_GOOD;
    UA_VariableAttributes editAttr = attr;
    UA_DataValue value;
    UA_DataValue_init(&value);
    if(dataSource.read)
        retval = dataSource.read(dataSource.handle, requestedNewNodeId,
                                 false, NULL, &value);
    else
        retval = UA_STATUSCODE_BADTYPEMISMATCH;
    editAttr.value = value.value;

    if(retval != UA_STATUSCODE_GOOD) {
        UA_NodeStore_deleteNode((UA_Node*)node);
        return retval;
    }

    /* Copy attributes into node */
    UA_RCU_LOCK();
    UA_AddNodesItem item;
    UA_AddNodesItem_init(&item);
    item.requestedNewNodeId.nodeId = requestedNewNodeId;
    item.browseName = browseName;
    item.typeDefinition.nodeId = typeDefinition;
    item.parentNodeId.nodeId = parentNodeId;
    retval |= copyStandardAttributes((UA_Node*)node, &item, (const UA_NodeAttributes*)&editAttr);
    retval |= copyVariableNodeAttributes(server, node, &item, &editAttr);
    UA_DataValue_deleteMembers(&node->value.data.value);
    node->valueSource = UA_VALUESOURCE_DATASOURCE;
    node->value.dataSource = dataSource;
    UA_DataValue_deleteMembers(&value);
    if(retval != UA_STATUSCODE_GOOD) {
        UA_NodeStore_deleteNode((UA_Node*)node);
        UA_RCU_UNLOCK();
        return retval;
    }

    /* Add the node */
    UA_AddNodesResult result;
    UA_AddNodesResult_init(&result);
    retval = Service_AddNodes_existing(server, &adminSession, (UA_Node*)node, &parentNodeId,
                                       &referenceTypeId, &typeDefinition, NULL, outNewNodeId);
    UA_RCU_UNLOCK();
    return retval;
}